

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_uv_area)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  REF_STATUS RVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  *min_uv_area = -2.0;
  if (((node < 0) || (pRVar1 = ref_cell->ref_adj, pRVar1->nnode <= node)) ||
     (lVar8 = (long)pRVar1->first[(uint)node], lVar8 == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xf2,
           "ref_smooth_tri_uv_area_around","no triangle found, can not compute min uv area");
    RVar5 = 1;
  }
  else {
    uVar3 = ref_cell_nodes(ref_cell,pRVar1->item[lVar8].ref,local_a8);
    if (uVar3 == 0) {
      bVar9 = false;
      do {
        uVar3 = ref_geom_uv_area_sign(ref_grid,local_a8[ref_cell->node_per],&local_b0);
        if (uVar3 != 0) {
          uVar6 = (ulong)uVar3;
          pcVar7 = "sign";
          uVar4 = 0xe7;
          goto LAB_001cf4ff;
        }
        uVar3 = ref_geom_uv_area(ref_grid->geom,local_a8,&local_b8);
        if (uVar3 != 0) {
          uVar6 = (ulong)uVar3;
          pcVar7 = "uv area";
          uVar4 = 0xe8;
          goto LAB_001cf4ff;
        }
        local_b8 = local_b0 * local_b8;
        dVar10 = local_b8;
        if ((bVar9) && (dVar10 = *min_uv_area, local_b8 <= *min_uv_area)) {
          dVar10 = local_b8;
        }
        *min_uv_area = dVar10;
        pRVar2 = ref_cell->ref_adj->item;
        lVar8 = (long)pRVar2[(int)lVar8].next;
        if (lVar8 == -1) {
          return 0;
        }
        uVar3 = ref_cell_nodes(ref_cell,pRVar2[lVar8].ref,local_a8);
        bVar9 = true;
      } while (uVar3 == 0);
    }
    uVar6 = (ulong)uVar3;
    pcVar7 = "nodes";
    uVar4 = 0xe5;
LAB_001cf4ff:
    RVar5 = (REF_STATUS)uVar6;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar4,
           "ref_smooth_tri_uv_area_around",uVar6,pcVar7);
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,
                                                        REF_INT node,
                                                        REF_DBL *min_uv_area) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT id, item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL sign_uv_area, uv_area;

  *min_uv_area = -2.0;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= sign_uv_area;
    if (none_found) {
      *min_uv_area = uv_area;
      none_found = REF_FALSE;
    } else {
      *min_uv_area = MIN(*min_uv_area, uv_area);
    }
  }

  if (none_found) THROW("no triangle found, can not compute min uv area");

  return REF_SUCCESS;
}